

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O3

void secp256k1_fe_mul_int_unchecked(secp256k1_fe *r,int a)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  secp256k1_modinv64_modinfo *psVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  secp256k1_ge *a_00;
  long lVar9;
  ulong uVar10;
  secp256k1_ge *psVar11;
  secp256k1_ge *psVar12;
  secp256k1_ge *a_01;
  uint64_t *puVar13;
  ulong uVar14;
  uint64_t *puVar15;
  long lVar16;
  long lVar17;
  uint uVar18;
  ulong uVar19;
  secp256k1_ge *psVar20;
  secp256k1_modinv64_modinfo *unaff_R15;
  secp256k1_modinv64_modinfo *psVar21;
  secp256k1_modinv64_modinfo *psVar22;
  bool bVar23;
  undefined1 auVar24 [16];
  secp256k1_strauss_state sStack_b40;
  secp256k1_gej sStack_b28;
  secp256k1_fe asStack_a90 [8];
  secp256k1_ge asStack_910 [8];
  secp256k1_strauss_point_state sStack_5d0;
  ulong uStack_1c0;
  secp256k1_ge *psStack_1b8;
  secp256k1_modinv64_modinfo *psStack_1b0;
  secp256k1_ge *psStack_1a0;
  secp256k1_modinv64_modinfo *psStack_198;
  ulong uStack_190;
  secp256k1_ge *psStack_188;
  ulong uStack_180;
  ulong uStack_178;
  ulong uStack_170;
  secp256k1_modinv64_modinfo *psStack_168;
  ulong uStack_160;
  secp256k1_modinv64_modinfo *psStack_158;
  ulong uStack_150;
  undefined1 auStack_148 [48];
  secp256k1_modinv64_modinfo *psStack_118;
  ulong uStack_110;
  ulong uStack_108;
  secp256k1_ge *psStack_100;
  undefined1 auStack_f8 [56];
  ulong uStack_c0;
  ulong uStack_b8;
  secp256k1_ge *psStack_b0;
  secp256k1_modinv64_signed62 sStack_a8;
  secp256k1_modinv64_signed62 sStack_78;
  secp256k1_ge *psStack_50;
  
  uVar2 = (ulong)(uint)a;
  psVar20 = (secp256k1_ge *)r;
  secp256k1_fe_verify(r);
  if ((uint)a < 0x21) {
    iVar1 = r->magnitude * a;
    if (iVar1 < 0x21) {
      r->n[0] = r->n[0] * uVar2;
      r->n[1] = r->n[1] * uVar2;
      r->n[2] = r->n[2] * uVar2;
      r->n[3] = r->n[3] * uVar2;
      r->n[4] = uVar2 * r->n[4];
      r->magnitude = iVar1;
      r->normalized = 0;
      secp256k1_fe_verify(r);
      return;
    }
  }
  else {
    secp256k1_fe_mul_int_unchecked_cold_2();
  }
  secp256k1_fe_mul_int_unchecked_cold_1();
  secp256k1_fe_verify(&psVar20->x);
  a_00 = psVar20;
  secp256k1_fe_verify_magnitude(&psVar20->x,0x1f);
  psVar4 = (secp256k1_modinv64_modinfo *)(psVar20->x).n[0];
  uVar2 = -(ulong)((uint)psVar4 & 1);
  uVar5 = uVar2 >> 0xc;
  uVar10 = (long)(psVar4->modulus).v + (uVar5 & 0xffffefffffc2f);
  if ((uVar10 & 1) == 0) {
    uVar3 = (uVar2 >> 0x10) + (psVar20->x).n[4];
    uVar6 = uVar5 + (psVar20->x).n[3];
    uVar18 = (uint)(uVar2 >> 0x2c);
    auVar24._0_8_ = CONCAT44(uVar18,(int)uVar5);
    auVar24._8_4_ = (int)uVar5;
    auVar24._12_4_ = uVar18;
    uVar2 = auVar24._0_8_ + (psVar20->x).n[1];
    uVar5 = auVar24._8_8_ + (psVar20->x).n[2];
    (psVar20->x).n[0] = ((ulong)((uint)uVar2 & 1) << 0x33) + (uVar10 >> 1);
    (psVar20->x).n[1] = ((uVar5 & 1) << 0x33) + (uVar2 >> 1);
    (psVar20->x).n[2] = ((uVar6 & 1) << 0x33) + (uVar5 >> 1);
    (psVar20->x).n[3] = ((ulong)((uint)uVar3 & 1) << 0x33) + (uVar6 >> 1);
    (psVar20->x).n[4] = uVar3 >> 1;
    (psVar20->x).magnitude = ((psVar20->x).magnitude >> 1) + 1;
    (psVar20->x).normalized = 0;
    secp256k1_fe_verify(&psVar20->x);
    return;
  }
  secp256k1_fe_half_cold_1();
  uVar3 = 0;
  sStack_a8.v[2] = 0;
  sStack_a8.v[3] = 0;
  sStack_a8.v[0] = 0;
  sStack_a8.v[1] = 0;
  sStack_a8.v[4] = 0;
  sStack_78.v[3] = 0;
  sStack_78.v[4] = 0;
  sStack_78.v[1] = 0;
  sStack_78.v[2] = 0;
  sStack_78.v[0] = 1;
  uStack_190 = (psVar4->modulus).v[4];
  auStack_148._0_8_ = (psVar4->modulus).v[0];
  uStack_160 = (psVar4->modulus).v[1];
  uStack_178 = (psVar4->modulus).v[2];
  uVar2 = (psVar4->modulus).v[3];
  auStack_f8._0_8_ = (a_00->x).n[0];
  psStack_158 = (secp256k1_modinv64_modinfo *)(a_00->x).n[1];
  psStack_168 = (secp256k1_modinv64_modinfo *)(a_00->x).n[2];
  uStack_180 = (a_00->x).n[3];
  auStack_f8._32_8_ = (a_00->x).n[4];
  uVar10 = 0xffffffffffffffff;
  psVar21 = (secp256k1_modinv64_modinfo *)auStack_f8._0_8_;
  uVar5 = auStack_148._0_8_;
  psStack_198 = psVar4;
  psStack_188 = (secp256k1_ge *)auStack_f8._32_8_;
  auStack_148._8_8_ = uStack_160;
  auStack_148._16_8_ = uStack_178;
  auStack_148._24_8_ = uVar2;
  auStack_148._32_8_ = uStack_190;
  auStack_148._40_8_ = a_00;
  auStack_f8._8_8_ = psStack_158;
  auStack_f8._16_8_ = psStack_168;
  auStack_f8._24_8_ = uStack_180;
  psStack_50 = psVar20;
  do {
    psVar20 = (secp256k1_ge *)0x8;
    lVar7 = 3;
    uVar6 = 0;
    uVar19 = 0;
    psVar11 = (secp256k1_ge *)0x8;
    psStack_1a0 = (secp256k1_ge *)0x8;
    psVar4 = psVar21;
    uVar8 = uVar5;
    psVar12 = a_00;
    psVar22 = unaff_R15;
    do {
      uStack_150 = uVar2;
      if ((uVar8 & 1) == 0) {
        psStack_1b0 = (secp256k1_modinv64_modinfo *)0x14c974;
        secp256k1_modinv64_cold_29();
LAB_0014c974:
        psStack_1b0 = (secp256k1_modinv64_modinfo *)0x14c979;
        secp256k1_modinv64_cold_1();
LAB_0014c979:
        psStack_1b0 = (secp256k1_modinv64_modinfo *)0x14c97e;
        secp256k1_modinv64_cold_2();
LAB_0014c97e:
        psStack_1b0 = (secp256k1_modinv64_modinfo *)0x14c983;
        secp256k1_modinv64_cold_28();
        goto LAB_0014c983;
      }
      psVar12 = (secp256k1_ge *)(uVar6 * (long)psVar21 + (long)psVar20 * uVar5);
      psVar11 = (secp256k1_ge *)(uVar8 << ((byte)lVar7 & 0x3f));
      if (psVar12 != psVar11) goto LAB_0014c974;
      psVar12 = (secp256k1_ge *)((long)psStack_1a0 * (long)psVar21 + uVar19 * uVar5);
      psVar11 = (secp256k1_ge *)((long)psVar4 << ((byte)lVar7 & 0x3f));
      if (psVar12 != psVar11) goto LAB_0014c979;
      psVar11 = (secp256k1_ge *)((long)uVar10 >> 0x3f);
      uStack_108 = (ulong)((uint)psVar4 & 1);
      uVar14 = -uStack_108;
      psVar12 = (secp256k1_ge *)((ulong)psVar11 & uVar14);
      uVar10 = uVar10 ^ (ulong)psVar12;
      psVar22 = psVar21;
      psStack_100 = psVar11;
      if (uVar10 - 0x251 < 0xfffffffffffffb61) goto LAB_0014c97e;
      uVar10 = uVar10 - 1;
      a_00 = (secp256k1_ge *)
             ((long)(psStack_1a0->x).n + (((ulong)psVar11 ^ uVar6) - (long)psVar11 & uVar14));
      uVar6 = (uVar6 + ((ulong)a_00 & (ulong)psVar12)) * 2;
      uVar19 = uVar19 + (((ulong)psVar11 ^ (ulong)psVar20) - (long)psVar11 & uVar14);
      psVar20 = (secp256k1_ge *)(((long)(psVar20->x).n + (uVar19 & (ulong)psVar12)) * 2);
      uVar14 = (long)(psVar4->modulus).v + (((ulong)psVar11 ^ uVar8) - (long)psVar11 & uVar14);
      psVar4 = (secp256k1_modinv64_modinfo *)(uVar14 >> 1);
      uVar8 = uVar8 + (uVar14 & (ulong)psVar12);
      lVar7 = lVar7 + 1;
      psStack_1a0 = a_00;
    } while (lVar7 != 0x3e);
    psVar11 = (secp256k1_ge *)(uVar6 * uVar19);
    unaff_R15 = psVar21;
    uStack_170 = uVar5;
    uStack_110 = uVar3;
    auStack_f8._48_8_ = psVar20;
    uStack_c0 = uVar6;
    uStack_b8 = uVar19;
    psStack_b0 = a_00;
    if ((SUB168(SEXT816((long)psVar20) * SEXT816((long)a_00),8) -
        SUB168(SEXT816((long)uVar6) * SEXT816((long)uVar19),8)) -
        (ulong)((secp256k1_ge *)((long)psVar20 * (long)a_00) < psVar11) != 2 ||
        (long)psVar20 * (long)a_00 - (long)psVar11 != 0) goto LAB_0014c9fb;
    psStack_1b0 = (secp256k1_modinv64_modinfo *)0x14c189;
    secp256k1_modinv64_update_de_62
              (&sStack_a8,&sStack_78,(secp256k1_modinv64_trans2x2 *)(auStack_f8 + 0x30),psStack_198)
    ;
    a_01 = (secp256k1_ge *)auStack_148;
    psVar11 = (secp256k1_ge *)0x5;
    psStack_1b0 = (secp256k1_modinv64_modinfo *)0x14c1a7;
    psVar12 = a_01;
    iVar1 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)a_01,5,&psStack_198->modulus,-1);
    if (iVar1 < 1) {
LAB_0014c983:
      a_01 = psVar12;
      psStack_1b0 = (secp256k1_modinv64_modinfo *)0x14c988;
      secp256k1_modinv64_cold_27();
LAB_0014c988:
      psStack_1b0 = (secp256k1_modinv64_modinfo *)0x14c98d;
      secp256k1_modinv64_cold_26();
LAB_0014c98d:
      a_00 = a_01;
      psStack_1b0 = (secp256k1_modinv64_modinfo *)0x14c992;
      secp256k1_modinv64_cold_25();
LAB_0014c992:
      psStack_1b0 = (secp256k1_modinv64_modinfo *)0x14c997;
      secp256k1_modinv64_cold_24();
LAB_0014c997:
      psStack_1b0 = (secp256k1_modinv64_modinfo *)0x14c99c;
      secp256k1_modinv64_cold_4();
LAB_0014c99c:
      psStack_1b0 = (secp256k1_modinv64_modinfo *)0x14c9a1;
      secp256k1_modinv64_cold_5();
      psVar21 = psVar22;
LAB_0014c9a1:
      psStack_1b0 = (secp256k1_modinv64_modinfo *)0x14c9a6;
      secp256k1_modinv64_cold_21();
LAB_0014c9a6:
      psStack_1b0 = (secp256k1_modinv64_modinfo *)0x14c9ab;
      secp256k1_modinv64_cold_20();
LAB_0014c9ab:
      psStack_1b0 = (secp256k1_modinv64_modinfo *)0x14c9b0;
      secp256k1_modinv64_cold_19();
LAB_0014c9b0:
      psStack_1b0 = (secp256k1_modinv64_modinfo *)0x14c9b5;
      secp256k1_modinv64_cold_18();
LAB_0014c9b5:
      psStack_1b0 = (secp256k1_modinv64_modinfo *)0x14c9ba;
      secp256k1_modinv64_cold_17();
LAB_0014c9ba:
      psStack_1b0 = (secp256k1_modinv64_modinfo *)0x14c9bf;
      secp256k1_modinv64_cold_16();
LAB_0014c9bf:
      psStack_1b0 = (secp256k1_modinv64_modinfo *)0x14c9c4;
      secp256k1_modinv64_cold_15();
      unaff_R15 = psVar21;
LAB_0014c9c4:
      psStack_1b0 = (secp256k1_modinv64_modinfo *)0x14c9c9;
      secp256k1_modinv64_cold_14();
LAB_0014c9c9:
      psStack_1b0 = (secp256k1_modinv64_modinfo *)0x14c9ce;
      secp256k1_modinv64_cold_13();
LAB_0014c9ce:
      psStack_1b0 = (secp256k1_modinv64_modinfo *)0x14c9d3;
      secp256k1_modinv64_cold_12();
LAB_0014c9d3:
      psVar12 = a_00;
      psStack_1b0 = (secp256k1_modinv64_modinfo *)0x14c9d8;
      secp256k1_modinv64_cold_11();
LAB_0014c9d8:
      psStack_1b0 = (secp256k1_modinv64_modinfo *)0x14c9dd;
      secp256k1_modinv64_cold_10();
LAB_0014c9dd:
      a_00 = psVar12;
      psStack_1b0 = (secp256k1_modinv64_modinfo *)0x14c9e2;
      secp256k1_modinv64_cold_9();
LAB_0014c9e2:
      psStack_1b0 = (secp256k1_modinv64_modinfo *)0x14c9e7;
      secp256k1_modinv64_cold_8();
      psVar21 = unaff_R15;
LAB_0014c9e7:
      psStack_1b0 = (secp256k1_modinv64_modinfo *)0x14c9ec;
      secp256k1_modinv64_cold_23();
LAB_0014c9ec:
      unaff_R15 = psVar21;
      psStack_1b0 = (secp256k1_modinv64_modinfo *)0x14c9f1;
      secp256k1_modinv64_cold_22();
      goto LAB_0014c9f1;
    }
    psVar11 = (secp256k1_ge *)0x5;
    psStack_1b0 = (secp256k1_modinv64_modinfo *)0x14c1c6;
    iVar1 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)a_01,5,&psStack_198->modulus,1);
    if (0 < iVar1) goto LAB_0014c988;
    a_00 = (secp256k1_ge *)auStack_f8;
    psVar11 = (secp256k1_ge *)0x5;
    psStack_1b0 = (secp256k1_modinv64_modinfo *)0x14c1ef;
    a_01 = a_00;
    iVar1 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)a_00,5,&psStack_198->modulus,-1);
    if (iVar1 < 1) goto LAB_0014c98d;
    psVar11 = (secp256k1_ge *)0x5;
    psStack_1b0 = (secp256k1_modinv64_modinfo *)0x14c20e;
    iVar1 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)a_00,5,&psStack_198->modulus,1);
    unaff_R15 = psStack_198;
    if (-1 < iVar1) goto LAB_0014c992;
    psVar11 = (secp256k1_ge *)((long)psVar20 * uStack_170);
    lVar7 = SUB168(SEXT816((long)psVar20) * SEXT816((long)uStack_170),8);
    uVar2 = uVar6 * (long)psVar21;
    a_00 = SUB168(SEXT816((long)uVar6) * SEXT816((long)psVar21),8);
    if ((-1 < (long)a_00) &&
       (uVar5 = (ulong)((secp256k1_ge *)(-1 - uVar2) < psVar11),
       lVar9 = (0x7fffffffffffffff - (long)a_00) - lVar7,
       (SBORROW8(0x7fffffffffffffff - (long)a_00,lVar7) != SBORROW8(lVar9,uVar5)) !=
       (long)(lVar9 - uVar5) < 0)) goto LAB_0014c9e7;
    puVar13 = (uint64_t *)((long)(psVar11->x).n + uVar2);
    a_00 = (secp256k1_ge *)((long)(a_00->x).n + (ulong)CARRY8(uVar2,(ulong)psVar11) + lVar7);
    uVar2 = uVar19 * uStack_170;
    lVar7 = SUB168(SEXT816((long)uVar19) * SEXT816((long)uStack_170),8);
    psVar11 = (secp256k1_ge *)((long)psStack_1a0 * (long)psVar21);
    lVar9 = SUB168(SEXT816((long)psStack_1a0) * SEXT816((long)psVar21),8);
    if ((-1 < lVar9) &&
       (uVar5 = (ulong)(-(long)psVar11 - 1U < uVar2), lVar17 = (0x7fffffffffffffff - lVar9) - lVar7,
       (SBORROW8(0x7fffffffffffffff - lVar9,lVar7) != SBORROW8(lVar17,uVar5)) !=
       (long)(lVar17 - uVar5) < 0)) goto LAB_0014c9ec;
    bVar23 = CARRY8((ulong)psVar11,uVar2);
    psVar11 = (secp256k1_ge *)((long)(psVar11->x).n + uVar2);
    lVar7 = lVar9 + lVar7 + (ulong)bVar23;
    if (((ulong)puVar13 & 0x3ffffffffffffffe) != 0) goto LAB_0014c997;
    if (((ulong)psVar11 & 0x3fffffffffffffff) != 0) goto LAB_0014c99c;
    uVar2 = (ulong)puVar13 >> 0x3e | (long)a_00 * 4;
    uVar5 = uStack_160 * (long)psVar20 + uVar2;
    lVar9 = SUB168(SEXT816((long)uStack_160) * SEXT816((long)psVar20),8) + ((long)a_00 >> 0x3e) +
            (ulong)CARRY8(uStack_160 * (long)psVar20,uVar2);
    uVar2 = (long)psStack_158 * uVar6;
    a_00 = SUB168(SEXT816((long)psStack_158) * SEXT816((long)uVar6),8);
    if (-1 < (long)a_00) {
      uVar3 = (ulong)(-uVar2 - 1 < uVar5);
      lVar17 = (0x7fffffffffffffff - (long)a_00) - lVar9;
      if ((SBORROW8(0x7fffffffffffffff - (long)a_00,lVar9) != SBORROW8(lVar17,uVar3)) ==
          (long)(lVar17 - uVar3) < 0) goto LAB_0014c346;
      goto LAB_0014c9a1;
    }
    lVar16 = (-0x8000000000000000 - (long)a_00) - (ulong)(uVar2 != 0);
    lVar17 = lVar9 - lVar16;
    if ((SBORROW8(lVar9,lVar16) != SBORROW8(lVar17,(ulong)(uVar5 < -uVar2))) !=
        (long)(lVar17 - (ulong)(uVar5 < -uVar2)) < 0) goto LAB_0014c9a1;
LAB_0014c346:
    uVar3 = (ulong)psVar11 >> 0x3e | lVar7 * 4;
    a_00 = (secp256k1_ge *)((long)(a_00->x).n + (ulong)CARRY8(uVar2,uVar5) + lVar9);
    uVar8 = uStack_160 * uVar19 + uVar3;
    lVar7 = SUB168(SEXT816((long)uStack_160) * SEXT816((long)uVar19),8) + (lVar7 >> 0x3e) +
            (ulong)CARRY8(uStack_160 * uVar19,uVar3);
    uVar3 = (long)psStack_158 * (long)psStack_1a0;
    psVar11 = SUB168(SEXT816((long)psStack_158) * SEXT816((long)psStack_1a0),8);
    if (-1 < (long)psVar11) {
      uVar14 = (ulong)(-uVar3 - 1 < uVar8);
      lVar9 = (0x7fffffffffffffff - (long)psVar11) - lVar7;
      if ((SBORROW8(0x7fffffffffffffff - (long)psVar11,lVar7) != SBORROW8(lVar9,uVar14)) ==
          (long)(lVar9 - uVar14) < 0) goto LAB_0014c3c6;
      goto LAB_0014c9a6;
    }
    lVar17 = (-0x8000000000000000 - (long)psVar11) - (ulong)(uVar3 != 0);
    lVar9 = lVar7 - lVar17;
    if ((SBORROW8(lVar7,lVar17) != SBORROW8(lVar9,(ulong)(uVar8 < -uVar3))) !=
        (long)(lVar9 - (ulong)(uVar8 < -uVar3)) < 0) goto LAB_0014c9a6;
LAB_0014c3c6:
    psVar11 = (secp256k1_ge *)((long)(psVar11->x).n + (ulong)CARRY8(uVar3,uVar8) + lVar7);
    uVar14 = (long)a_00 * 4 | uVar2 + uVar5 >> 0x3e;
    uStack_170 = uVar2 + uVar5 & 0x3fffffffffffffff;
    psStack_118 = (secp256k1_modinv64_modinfo *)(uVar3 + uVar8 & 0x3fffffffffffffff);
    psVar12 = (secp256k1_ge *)(uStack_178 * (long)psVar20 + uVar14);
    lVar7 = SUB168(SEXT816((long)uStack_178) * SEXT816((long)psVar20),8) + ((long)a_00 >> 0x3e) +
            (ulong)CARRY8(uStack_178 * (long)psVar20,uVar14);
    uVar2 = (long)psStack_168 * uVar6;
    lVar9 = SUB168(SEXT816((long)psStack_168) * SEXT816((long)uVar6),8);
    psVar21 = psStack_168;
    auStack_148._0_8_ = uStack_170;
    auStack_f8._0_8_ = psStack_118;
    if (-1 < lVar9) {
      a_00 = (secp256k1_ge *)(-1 - uVar2);
      lVar17 = (0x7fffffffffffffff - lVar9) - lVar7;
      if ((SBORROW8(0x7fffffffffffffff - lVar9,lVar7) != SBORROW8(lVar17,(ulong)(a_00 < psVar12)))
          == (long)(lVar17 - (ulong)(a_00 < psVar12)) < 0) goto LAB_0014c47c;
      goto LAB_0014c9ab;
    }
    lVar16 = (-0x8000000000000000 - lVar9) - (ulong)(uVar2 != 0);
    lVar17 = lVar7 - lVar16;
    a_00 = (secp256k1_ge *)(lVar17 - (ulong)(psVar12 < (secp256k1_ge *)-uVar2));
    if ((SBORROW8(lVar7,lVar16) != SBORROW8(lVar17,(ulong)(psVar12 < (secp256k1_ge *)-uVar2))) !=
        (long)a_00 < 0) goto LAB_0014c9ab;
LAB_0014c47c:
    uVar5 = uVar3 + uVar8 >> 0x3e | (long)psVar11 * 4;
    puVar13 = (uint64_t *)((long)(psVar12->x).n + uVar2);
    lVar7 = lVar7 + lVar9 + (ulong)CARRY8((ulong)psVar12,uVar2);
    psVar12 = (secp256k1_ge *)(uStack_178 * uVar19 + uVar5);
    a_00 = (secp256k1_ge *)
           (SUB168(SEXT816((long)uStack_178) * SEXT816((long)uVar19),8) + ((long)psVar11 >> 0x3e) +
           (ulong)CARRY8(uStack_178 * uVar19,uVar5));
    uVar2 = (long)psStack_168 * (long)psStack_1a0;
    lVar9 = SUB168(SEXT816((long)psStack_168) * SEXT816((long)psStack_1a0),8);
    if (-1 < lVar9) {
      psVar11 = (secp256k1_ge *)(-1 - uVar2);
      lVar17 = (0x7fffffffffffffff - lVar9) - (long)a_00;
      if ((SBORROW8(0x7fffffffffffffff - lVar9,(long)a_00) !=
          SBORROW8(lVar17,(ulong)(psVar11 < psVar12))) ==
          (long)(lVar17 - (ulong)(psVar11 < psVar12)) < 0) goto LAB_0014c4eb;
      goto LAB_0014c9b0;
    }
    lVar16 = (-0x8000000000000000 - lVar9) - (ulong)(uVar2 != 0);
    lVar17 = (long)a_00 - lVar16;
    psVar11 = (secp256k1_ge *)(lVar17 - (ulong)(psVar12 < (secp256k1_ge *)-uVar2));
    if ((SBORROW8((long)a_00,lVar16) != SBORROW8(lVar17,(ulong)(psVar12 < (secp256k1_ge *)-uVar2)))
        != (long)psVar11 < 0) goto LAB_0014c9b0;
LAB_0014c4eb:
    puVar15 = (uint64_t *)((long)(psVar12->x).n + uVar2);
    a_00 = (secp256k1_ge *)((long)(a_00->x).n + (ulong)CARRY8((ulong)psVar12,uVar2) + lVar9);
    uVar2 = lVar7 * 4 | (ulong)puVar13 >> 0x3e;
    auStack_148._8_8_ = (ulong)puVar13 & 0x3fffffffffffffff;
    psVar21 = (secp256k1_modinv64_modinfo *)((ulong)puVar15 & 0x3fffffffffffffff);
    uVar5 = uStack_150 * (long)psVar20 + uVar2;
    psVar11 = (secp256k1_ge *)
              (SUB168(SEXT816((long)uStack_150) * SEXT816((long)psVar20),8) + (lVar7 >> 0x3e) +
              (ulong)CARRY8(uStack_150 * (long)psVar20,uVar2));
    uVar2 = uStack_180 * uVar6;
    lVar7 = SUB168(SEXT816((long)uStack_180) * SEXT816((long)uVar6),8);
    auStack_f8._8_8_ = psVar21;
    if (-1 < lVar7) {
      uVar3 = (ulong)(-uVar2 - 1 < uVar5);
      lVar9 = (0x7fffffffffffffff - lVar7) - (long)psVar11;
      if ((SBORROW8(0x7fffffffffffffff - lVar7,(long)psVar11) != SBORROW8(lVar9,uVar3)) ==
          (long)(lVar9 - uVar3) < 0) goto LAB_0014c57d;
      goto LAB_0014c9b5;
    }
    lVar17 = (-0x8000000000000000 - lVar7) - (ulong)(uVar2 != 0);
    lVar9 = (long)psVar11 - lVar17;
    if ((SBORROW8((long)psVar11,lVar17) != SBORROW8(lVar9,(ulong)(uVar5 < -uVar2))) !=
        (long)(lVar9 - (ulong)(uVar5 < -uVar2)) < 0) goto LAB_0014c9b5;
LAB_0014c57d:
    uVar3 = (ulong)puVar15 >> 0x3e | (long)a_00 * 4;
    psVar11 = (secp256k1_ge *)((long)(psVar11->x).n + (ulong)CARRY8(uVar5,uVar2) + lVar7);
    psVar12 = (secp256k1_ge *)(uStack_150 * uVar19 + uVar3);
    lVar7 = SUB168(SEXT816((long)uStack_150) * SEXT816((long)uVar19),8) + ((long)a_00 >> 0x3e) +
            (ulong)CARRY8(uStack_150 * uVar19,uVar3);
    uVar3 = uStack_180 * (long)psStack_1a0;
    lVar9 = SUB168(SEXT816((long)uStack_180) * SEXT816((long)psStack_1a0),8);
    if (-1 < lVar9) {
      a_00 = (secp256k1_ge *)(-1 - uVar3);
      lVar17 = (0x7fffffffffffffff - lVar9) - lVar7;
      if ((SBORROW8(0x7fffffffffffffff - lVar9,lVar7) != SBORROW8(lVar17,(ulong)(a_00 < psVar12)))
          == (long)(lVar17 - (ulong)(a_00 < psVar12)) < 0) goto LAB_0014c5f5;
      goto LAB_0014c9ba;
    }
    lVar16 = (-0x8000000000000000 - lVar9) - (ulong)(uVar3 != 0);
    lVar17 = lVar7 - lVar16;
    a_00 = (secp256k1_ge *)(lVar17 - (ulong)(psVar12 < (secp256k1_ge *)-uVar3));
    if ((SBORROW8(lVar7,lVar16) != SBORROW8(lVar17,(ulong)(psVar12 < (secp256k1_ge *)-uVar3))) !=
        (long)a_00 < 0) goto LAB_0014c9ba;
LAB_0014c5f5:
    puVar13 = (uint64_t *)((long)(psVar12->x).n + uVar3);
    lVar7 = lVar7 + lVar9 + (ulong)CARRY8((ulong)psVar12,uVar3);
    uVar3 = (long)psVar11 * 4 | uVar5 + uVar2 >> 0x3e;
    auStack_148._16_8_ = uVar5 + uVar2 & 0x3fffffffffffffff;
    psStack_168 = (secp256k1_modinv64_modinfo *)((ulong)puVar13 & 0x3fffffffffffffff);
    auVar24 = SEXT816((long)psVar20);
    uVar2 = uStack_190 * (long)psVar20;
    psVar20 = (secp256k1_ge *)(uVar2 + uVar3);
    a_00 = (secp256k1_ge *)
           (SUB168(SEXT816((long)uStack_190) * auVar24,8) + ((long)psVar11 >> 0x3e) +
           (ulong)CARRY8(uVar2,uVar3));
    uVar2 = (long)psStack_188 * uVar6;
    lVar9 = SUB168(SEXT816((long)psStack_188) * SEXT816((long)uVar6),8);
    if (lVar9 < 0) {
      lVar16 = (-0x8000000000000000 - lVar9) - (ulong)(uVar2 != 0);
      lVar17 = (long)a_00 - lVar16;
      bVar23 = SBORROW8((long)a_00,lVar16) !=
               SBORROW8(lVar17,(ulong)(psVar20 < (secp256k1_ge *)-uVar2));
      psVar11 = (secp256k1_ge *)(lVar17 - (ulong)(psVar20 < (secp256k1_ge *)-uVar2));
      psVar12 = psVar11;
    }
    else {
      psVar11 = (secp256k1_ge *)(-1 - uVar2);
      lVar17 = (0x7fffffffffffffff - lVar9) - (long)a_00;
      bVar23 = SBORROW8(0x7fffffffffffffff - lVar9,(long)a_00) !=
               SBORROW8(lVar17,(ulong)(psVar11 < psVar20));
      psVar12 = (secp256k1_ge *)(lVar17 - (ulong)(psVar11 < psVar20));
    }
    auStack_f8._16_8_ = psStack_168;
    if (bVar23 != (long)psVar12 < 0) goto LAB_0014c9bf;
    uVar5 = (ulong)puVar13 >> 0x3e | lVar7 * 4;
    puVar13 = (uint64_t *)((long)(psVar20->x).n + uVar2);
    a_00 = (secp256k1_ge *)((long)(a_00->x).n + (ulong)CARRY8((ulong)psVar20,uVar2) + lVar9);
    psVar20 = (secp256k1_ge *)(uStack_190 * uVar19 + uVar5);
    psVar11 = (secp256k1_ge *)
              (SUB168(SEXT816((long)uStack_190) * SEXT816((long)uVar19),8) + (lVar7 >> 0x3e) +
              (ulong)CARRY8(uStack_190 * uVar19,uVar5));
    uVar2 = (long)psStack_188 * (long)psStack_1a0;
    lVar7 = SUB168(SEXT816((long)psStack_188) * SEXT816((long)psStack_1a0),8);
    psStack_158 = psVar21;
    if (-1 < lVar7) {
      uVar5 = (ulong)((secp256k1_ge *)(-1 - uVar2) < psVar20);
      lVar9 = (0x7fffffffffffffff - lVar7) - (long)psVar11;
      if ((SBORROW8(0x7fffffffffffffff - lVar7,(long)psVar11) != SBORROW8(lVar9,uVar5)) ==
          (long)(lVar9 - uVar5) < 0) goto LAB_0014c73d;
      goto LAB_0014c9c4;
    }
    lVar17 = (-0x8000000000000000 - lVar7) - (ulong)(uVar2 != 0);
    lVar9 = (long)psVar11 - lVar17;
    if ((SBORROW8((long)psVar11,lVar17) != SBORROW8(lVar9,(ulong)(psVar20 < (secp256k1_ge *)-uVar2))
        ) != (long)(lVar9 - (ulong)(psVar20 < (secp256k1_ge *)-uVar2)) < 0) goto LAB_0014c9c4;
LAB_0014c73d:
    psVar12 = (secp256k1_ge *)auStack_148;
    bVar23 = CARRY8((ulong)psVar20,uVar2);
    psVar20 = (secp256k1_ge *)((long)(psVar20->x).n + uVar2);
    psVar11 = (secp256k1_ge *)((long)(psVar11->x).n + (ulong)bVar23 + lVar7);
    uVar5 = (long)a_00 * 4 | (ulong)puVar13 >> 0x3e;
    uVar2 = (ulong)puVar13 & 0x3fffffffffffffff;
    uStack_180 = (ulong)psVar20 & 0x3fffffffffffffff;
    a_00 = (secp256k1_ge *)(((long)a_00 >> 0x3e) + -1 + (ulong)(0x7fffffffffffffff < uVar5));
    uStack_178 = auStack_148._16_8_;
    uStack_160 = auStack_148._8_8_;
    auStack_148._24_8_ = uVar2;
    auStack_f8._24_8_ = uStack_180;
    if (a_00 != (secp256k1_ge *)0xffffffffffffffff) goto LAB_0014c9c9;
    psVar20 = (secp256k1_ge *)((ulong)psVar20 >> 0x3e | (long)psVar11 * 4);
    psVar11 = (secp256k1_ge *)
              (((long)psVar11 >> 0x3e) + -1 + (ulong)((secp256k1_ge *)0x7fffffffffffffff < psVar20))
    ;
    auStack_148._32_8_ = uVar5;
    if (psVar11 != (secp256k1_ge *)0xffffffffffffffff) goto LAB_0014c9ce;
    psVar11 = (secp256k1_ge *)0x5;
    psStack_1b0 = (secp256k1_modinv64_modinfo *)0x14c7d2;
    a_00 = psVar12;
    uStack_190 = uVar5;
    auStack_f8._32_8_ = psVar20;
    iVar1 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar12,5,&psStack_198->modulus,-1);
    if (iVar1 < 1) goto LAB_0014c9d3;
    psVar11 = (secp256k1_ge *)0x5;
    psStack_1b0 = (secp256k1_modinv64_modinfo *)0x14c7ef;
    iVar1 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar12,5,&unaff_R15->modulus,1);
    if (0 < iVar1) goto LAB_0014c9d8;
    a_00 = (secp256k1_ge *)auStack_f8;
    psVar11 = (secp256k1_ge *)0x5;
    psStack_1b0 = (secp256k1_modinv64_modinfo *)0x14c816;
    psVar12 = a_00;
    iVar1 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)a_00,5,&unaff_R15->modulus,-1);
    if (iVar1 < 1) goto LAB_0014c9dd;
    psVar11 = (secp256k1_ge *)0x5;
    psStack_1b0 = (secp256k1_modinv64_modinfo *)0x14c833;
    iVar1 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)a_00,5,&unaff_R15->modulus,1);
    if (-1 < iVar1) goto LAB_0014c9e2;
    uVar18 = (int)uStack_110 + 1;
    uVar3 = (ulong)uVar18;
    psVar21 = psStack_118;
    uVar5 = uStack_170;
    psStack_188 = psVar20;
  } while (uVar18 != 10);
  a_00 = (secp256k1_ge *)auStack_f8;
  psVar11 = (secp256k1_ge *)0x5;
  psStack_1b0 = (secp256k1_modinv64_modinfo *)0x14c87d;
  iVar1 = secp256k1_modinv64_mul_cmp_62
                    ((secp256k1_modinv64_signed62 *)a_00,5,&SECP256K1_SIGNED62_ONE,0);
  if (iVar1 != 0) {
LAB_0014c9f1:
    psStack_1b0 = (secp256k1_modinv64_modinfo *)0x14c9f6;
    secp256k1_modinv64_cold_6();
LAB_0014c9f6:
    psStack_1b0 = (secp256k1_modinv64_modinfo *)0x14c9fb;
    secp256k1_modinv64_cold_7();
LAB_0014c9fb:
    psStack_1b0 = (secp256k1_modinv64_modinfo *)secp256k1_eckey_pubkey_tweak_add;
    secp256k1_modinv64_cold_3();
    uStack_1c0 = uVar10;
    psStack_1b8 = psVar20;
    psStack_1b0 = unaff_R15;
    secp256k1_gej_set_ge(&sStack_b28,a_00);
    sStack_b40.aux = asStack_a90;
    sStack_b40.pre_a = asStack_910;
    sStack_b40.ps = &sStack_5d0;
    secp256k1_ecmult_strauss_wnaf
              (&sStack_b40,&sStack_b28,1,&sStack_b28,&secp256k1_scalar_one,
               (secp256k1_scalar *)psVar11);
    secp256k1_gej_verify(&sStack_b28);
    if (sStack_b28.infinity == 0) {
      secp256k1_ge_set_gej(a_00,&sStack_b28);
    }
    return;
  }
  psStack_1b0 = (secp256k1_modinv64_modinfo *)0x14c8a2;
  iVar1 = secp256k1_modinv64_mul_cmp_62
                    ((secp256k1_modinv64_signed62 *)auStack_148,5,&SECP256K1_SIGNED62_ONE,-1);
  psVar20 = (secp256k1_ge *)auStack_148._40_8_;
  if (iVar1 != 0) {
    psStack_1b0 = (secp256k1_modinv64_modinfo *)0x14c8c9;
    iVar1 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)auStack_148,5,&SECP256K1_SIGNED62_ONE,1);
    if (iVar1 != 0) {
      psVar11 = (secp256k1_ge *)0x5;
      psStack_1b0 = (secp256k1_modinv64_modinfo *)0x14c8e3;
      a_00 = psVar20;
      iVar1 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)psVar20,5,&SECP256K1_SIGNED62_ONE,0);
      if (iVar1 == 0) {
        a_00 = (secp256k1_ge *)&sStack_a8;
        psVar11 = (secp256k1_ge *)0x5;
        psStack_1b0 = (secp256k1_modinv64_modinfo *)0x14c906;
        iVar1 = secp256k1_modinv64_mul_cmp_62
                          ((secp256k1_modinv64_signed62 *)a_00,5,&SECP256K1_SIGNED62_ONE,0);
        if (iVar1 == 0) {
          a_00 = (secp256k1_ge *)auStack_148;
          psVar11 = (secp256k1_ge *)0x5;
          psStack_1b0 = (secp256k1_modinv64_modinfo *)0x14c925;
          iVar1 = secp256k1_modinv64_mul_cmp_62
                            ((secp256k1_modinv64_signed62 *)a_00,5,&unaff_R15->modulus,1);
          if (iVar1 == 0) goto LAB_0014c92d;
        }
      }
      goto LAB_0014c9f6;
    }
  }
LAB_0014c92d:
  psStack_1b0 = (secp256k1_modinv64_modinfo *)0x14c945;
  secp256k1_modinv64_normalize_62(&sStack_a8,uStack_190,unaff_R15);
  (psVar20->x).n[4] = sStack_a8.v[4];
  (psVar20->x).n[2] = sStack_a8.v[2];
  (psVar20->x).n[3] = sStack_a8.v[3];
  (psVar20->x).n[0] = sStack_a8.v[0];
  (psVar20->x).n[1] = sStack_a8.v[1];
  return;
}

Assistant:

SECP256K1_INLINE static void secp256k1_fe_mul_int_unchecked(secp256k1_fe *r, int a) {
    SECP256K1_FE_VERIFY(r);

    VERIFY_CHECK(a >= 0 && a <= 32);
    VERIFY_CHECK(a*r->magnitude <= 32);
    secp256k1_fe_impl_mul_int_unchecked(r, a);
    r->magnitude *= a;
    r->normalized = 0;

    SECP256K1_FE_VERIFY(r);
}